

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyClient.cpp
# Opt level: O0

void __thiscall ProxyClient::ProxyClient(ProxyClient *this)

{
  uint8_t *puVar1;
  ProxyClient *this_local;
  
  std::unique_ptr<net_uv::TCPServer,std::default_delete<net_uv::TCPServer>>::
  unique_ptr<std::default_delete<net_uv::TCPServer>,void>
            ((unique_ptr<net_uv::TCPServer,std::default_delete<net_uv::TCPServer>> *)this);
  std::unique_ptr<net_uv::Client,std::default_delete<net_uv::Client>>::
  unique_ptr<std::default_delete<net_uv::Client>,void>
            ((unique_ptr<net_uv::Client,std::default_delete<net_uv::Client>> *)&this->m_pipe);
  std::unique_ptr<Cypher,std::default_delete<Cypher>>::unique_ptr<std::default_delete<Cypher>,void>
            ((unique_ptr<Cypher,std::default_delete<Cypher>> *)&this->m_cypher);
  this->m_runStatus = STOP;
  std::__cxx11::string::string((string *)&this->m_remoteIP);
  std::__cxx11::string::string((string *)&this->m_username);
  std::__cxx11::string::string((string *)&this->m_password);
  this->m_recvBuffer = (char *)0x0;
  this->m_recvBufLen = 0;
  std::function<void_()>::function(&this->m_stopCall,(nullptr_t)0x0);
  net_uv::UVLoop::UVLoop(&this->m_loop);
  net_uv::UVTimer::UVTimer(&this->m_update);
  std::
  unordered_map<unsigned_int,_ProxyClient::SessionData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ProxyClient::SessionData>_>_>
  ::unordered_map(&this->m_sessionDataMap);
  puVar1 = (uint8_t *)malloc(0x40000);
  this->m_sendBuffer = puVar1;
  return;
}

Assistant:

ProxyClient::ProxyClient()
	: m_stopCall(nullptr)
	, m_runStatus(RUN_STATUS::STOP)
	, m_recvBuffer(NULL)
	, m_recvBufLen(0)
{
	m_sendBuffer = (uint8_t*)fc_malloc(MSG_MAX_SIZE);
}